

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3DriverBase::draw2DImage
          (COpenGL3DriverBase *this,ITexture *texture,u32 layer,bool flip)

{
  bool bVar1;
  long lVar2;
  S3DVertex quad2DVertices [4];
  undefined8 auStack_c4 [2];
  undefined8 uStack_b0;
  S3DVertex local_a8;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_6c;
  float local_64;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  undefined4 local_34;
  undefined8 local_24;
  float local_1c;
  
  if (texture != (ITexture *)0x0) {
    uStack_b0 = 0x20d2d3;
    chooseMaterial2D(this);
    uStack_b0 = 0x20d2e0;
    bVar1 = setMaterialTexture(this,0,texture);
    if (bVar1) {
      uStack_b0 = 0x20d2f7;
      setRenderStates2DMode(this,false,true,true);
      lVar2 = 0x1c;
      do {
        *(undefined8 *)(&stack0xffffffffffffff4c + lVar2) = 0;
        *(undefined8 *)((long)auStack_c4 + lVar2) = 0;
        *(undefined8 *)((long)auStack_c4 + lVar2 + 8) = 0;
        *(undefined4 *)((long)&uStack_b0 + lVar2 + 4) = 0xffffffff;
        *(undefined8 *)((long)&local_a8.Pos.X + lVar2) = 0;
        lVar2 = lVar2 + 0x24;
      } while (lVar2 != 0xac);
      local_a8.Pos.X = -1.0;
      local_a8.Pos.Y = 1.0;
      local_a8.Pos.Z = 0.0;
      local_84 = 0x3f8000003f800000;
      local_7c = 0;
      local_60 = 0xbf8000003f800000;
      local_58 = 0;
      local_3c = 0xbf800000bf800000;
      local_34 = 0;
      local_a8.TCoords.Y = 1.0;
      if (!flip) {
        local_a8.TCoords.Y = 0.0;
      }
      local_40 = 1.0 - local_a8.TCoords.Y;
      local_a8.Color.color = 0xffffffff;
      local_a8.TCoords.X = 0.0;
      local_6c = 0x3f800000ffffffff;
      local_48 = 0x3f800000ffffffff;
      local_24 = 0xffffffff;
      uStack_b0 = 0x20d3cb;
      local_64 = local_a8.TCoords.Y;
      local_1c = local_40;
      drawQuad(this,(VertexType *)vt2DImage,(S3DVertex (*) [4])&local_a8);
    }
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DImage(const video::ITexture *texture, u32 layer, bool flip)
{
	if (!texture)
		return;

	chooseMaterial2D();
	if (!setMaterialTexture(0, texture))
		return;

	setRenderStates2DMode(false, true, true);

	S3DVertex quad2DVertices[4];

	quad2DVertices[0].Pos = core::vector3df(-1.f, 1.f, 0.f);
	quad2DVertices[1].Pos = core::vector3df(1.f, 1.f, 0.f);
	quad2DVertices[2].Pos = core::vector3df(1.f, -1.f, 0.f);
	quad2DVertices[3].Pos = core::vector3df(-1.f, -1.f, 0.f);

	f32 modificator = (flip) ? 1.f : 0.f;

	quad2DVertices[0].TCoords = core::vector2df(0.f, 0.f + modificator);
	quad2DVertices[1].TCoords = core::vector2df(1.f, 0.f + modificator);
	quad2DVertices[2].TCoords = core::vector2df(1.f, 1.f - modificator);
	quad2DVertices[3].TCoords = core::vector2df(0.f, 1.f - modificator);

	quad2DVertices[0].Color = SColor(0xFFFFFFFF);
	quad2DVertices[1].Color = SColor(0xFFFFFFFF);
	quad2DVertices[2].Color = SColor(0xFFFFFFFF);
	quad2DVertices[3].Color = SColor(0xFFFFFFFF);

	drawQuad(vt2DImage, quad2DVertices);
}